

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O1

void square_smash_wall(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  uint32_t uVar2;
  loc grid_00;
  square *psVar3;
  trap_kind_conflict *ptVar4;
  long lVar5;
  
  square_set_feat(c,grid,L'\x01');
  lVar5 = 0;
  do {
    grid_00 = (loc)loc_sum((loc_conflict)grid,(loc_conflict)ddgrid_ddd[lVar5]);
    _Var1 = square_in_bounds_fully(c,grid_00);
    if (_Var1) {
      _Var1 = square_isperm(c,grid_00);
      if (!_Var1) {
        psVar3 = square(c,grid_00);
        _Var1 = flag_has_dbg(f_info[psVar3->feat].flags,4,0xf,"f_info[feat].flags","TF_FLOOR");
        if (_Var1) {
          ptVar4 = lookup_trap("decoy");
          _Var1 = square_trap_specific((chunk *)c,grid_00,ptVar4->tidx);
          if (_Var1) {
            square_destroy_decoy(c,grid_00);
          }
        }
        else {
          psVar3 = square(c,grid_00);
          _Var1 = flag_has_dbg(f_info[psVar3->feat].flags,4,0x12,"f_info[feat].flags","TF_GRANITE");
          if (_Var1) {
            uVar2 = Rand_div(4);
            if (uVar2 == 0) goto LAB_0012b07c;
          }
          psVar3 = square(c,grid_00);
          _Var1 = flag_has_dbg(f_info[psVar3->feat].flags,4,0x19,"f_info[feat].flags","TF_QUARTZ");
          if (_Var1) {
            uVar2 = Rand_div(10);
            if (uVar2 == 0) goto LAB_0012b07c;
          }
          psVar3 = square(c,grid_00);
          _Var1 = flag_has_dbg(f_info[psVar3->feat].flags,4,0x18,"f_info[feat].flags","TF_MAGMA");
          if (_Var1) {
            uVar2 = Rand_div(0x14);
            if (uVar2 == 0) goto LAB_0012b07c;
          }
          square_set_feat(c,grid_00,L'\x01');
        }
      }
    }
LAB_0012b07c:
    lVar5 = lVar5 + 1;
    if (lVar5 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void square_smash_wall(struct chunk *c, struct loc grid)
{
	int i;
	square_set_feat(c, grid, FEAT_FLOOR);

	for (i = 0; i < 8; i++) {
		/* Extract adjacent location */
		struct loc adj_grid = loc_sum(grid, ddgrid_ddd[i]);

		/* Check legality */
		if (!square_in_bounds_fully(c, adj_grid)) continue;

		/* Ignore permanent grids */
		if (square_isperm(c, adj_grid)) continue;

		/* Ignore floors, but destroy decoys */
		if (square_isfloor(c, adj_grid)) {
			if (square_isdecoyed(c, adj_grid)) {
				square_destroy_decoy(c, adj_grid);
			}
			continue;
		}

		/* Give this grid a chance to survive */
		if ((square_isgranite(c, adj_grid) && one_in_(4)) ||
			(square_isquartz(c, adj_grid) && one_in_(10)) ||
			(square_ismagma(c, adj_grid) && one_in_(20))) {
			continue;
		}

		/* Remove it */
		square_set_feat(c, adj_grid, FEAT_FLOOR);
	}
}